

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O0

bool __thiscall ON_3dmSettings::Write_v2(ON_3dmSettings *this,ON_BinaryArchive *file)

{
  bool bVar1;
  int iVar2;
  ON_PlugInRef *this_00;
  ON_3dmConstructionPlane *this_01;
  ON_3dmView *pOVar3;
  ON__INT32 local_70;
  int local_6c;
  int local_68;
  ON__INT32 local_64;
  int local_60;
  bool local_5b;
  bool local_5a;
  bool local_59;
  int V5_index_4;
  int V5_index_3;
  int V5_index_2;
  int V5_index_1;
  int V5_index;
  int count_2;
  int count_1;
  int count;
  bool rc;
  int i;
  ON_BinaryArchive *file_local;
  ON_3dmSettings *this_local;
  
  count_1._3_1_ = true;
  iVar2 = ON_BinaryArchive::Archive3dmVersion(file);
  if (((3 < iVar2) && (iVar2 = ON_ClassArray<ON_PlugInRef>::Count(&this->m_plugin_list), 0 < iVar2))
     && (count_1._3_1_ = ON_BinaryArchive::BeginWrite3dmChunk(file,0x20008135,0), count_1._3_1_)) {
    if (count_1._3_1_) {
      count_1._3_1_ = ON_BinaryArchive::Write3dmChunkVersion(file,1,0);
    }
    if (count_1._3_1_ != false) {
      iVar2 = ON_ClassArray<ON_PlugInRef>::Count(&this->m_plugin_list);
      count_1._3_1_ = ON_BinaryArchive::WriteInt(file,iVar2);
    }
    count = 0;
    while( true ) {
      bVar1 = false;
      if (count_1._3_1_ != false) {
        iVar2 = ON_ClassArray<ON_PlugInRef>::Count(&this->m_plugin_list);
        bVar1 = count < iVar2;
      }
      if (!bVar1) break;
      this_00 = ON_ClassArray<ON_PlugInRef>::operator[](&this->m_plugin_list,count);
      count_1._3_1_ = ON_PlugInRef::Write(this_00,file);
      count = count + 1;
    }
    bVar1 = ON_BinaryArchive::EndWrite3dmChunk(file);
    if (!bVar1) {
      count_1._3_1_ = false;
    }
  }
  if ((count_1._3_1_ != false) &&
     (count_1._3_1_ = ON_BinaryArchive::BeginWrite3dmChunk(file,0x20008031,0), count_1._3_1_)) {
    count_1._3_1_ = ON_3dmUnitsAndTolerances::Write(&this->m_ModelUnitsAndTolerances,file);
    bVar1 = ON_BinaryArchive::EndWrite3dmChunk(file);
    if (!bVar1) {
      count_1._3_1_ = false;
    }
  }
  if ((count_1._3_1_ != false) &&
     (count_1._3_1_ = ON_BinaryArchive::BeginWrite3dmChunk(file,0x20008032,0), count_1._3_1_)) {
    count_1._3_1_ = ON_MeshParameters::Write(&this->m_RenderMeshSettings,file);
    bVar1 = ON_BinaryArchive::EndWrite3dmChunk(file);
    if (!bVar1) {
      count_1._3_1_ = false;
    }
  }
  if ((count_1._3_1_ != false) &&
     (count_1._3_1_ = ON_BinaryArchive::BeginWrite3dmChunk(file,0x20008033,0), count_1._3_1_)) {
    count_1._3_1_ = ON_MeshParameters::Write(&this->m_AnalysisMeshSettings,file);
    bVar1 = ON_BinaryArchive::EndWrite3dmChunk(file);
    if (!bVar1) {
      count_1._3_1_ = false;
    }
  }
  if ((count_1._3_1_ != false) &&
     (count_1._3_1_ = ON_BinaryArchive::BeginWrite3dmChunk(file,0x20008034,0), count_1._3_1_)) {
    count_1._3_1_ = ON_3dmAnnotationSettings::Write(&this->m_AnnotationSettings,file);
    bVar1 = ON_BinaryArchive::EndWrite3dmChunk(file);
    if (!bVar1) {
      count_1._3_1_ = false;
    }
  }
  if ((count_1._3_1_ != false) &&
     (count_1._3_1_ = ON_BinaryArchive::BeginWrite3dmChunk(file,0x20008035,0), count_1._3_1_)) {
    iVar2 = ON_ClassArray<ON_3dmConstructionPlane>::Count(&this->m_named_cplanes);
    count_1._3_1_ = ON_BinaryArchive::WriteInt(file,iVar2);
    count = 0;
    while( true ) {
      local_59 = false;
      if (count < iVar2) {
        local_59 = count_1._3_1_;
      }
      if (local_59 == false) break;
      count_1._3_1_ = ON_BinaryArchive::BeginWrite3dmChunk(file,0x2000813b,0);
      if (count_1._3_1_) {
        this_01 = ON_ClassArray<ON_3dmConstructionPlane>::operator[](&this->m_named_cplanes,count);
        count_1._3_1_ = ON_3dmConstructionPlane::Write(this_01,file);
        bVar1 = ON_BinaryArchive::EndWrite3dmChunk(file);
        if (!bVar1) {
          count_1._3_1_ = false;
        }
      }
      count = count + 1;
    }
    bVar1 = ON_BinaryArchive::EndWrite3dmChunk(file);
    if (!bVar1) {
      count_1._3_1_ = false;
    }
  }
  if ((count_1._3_1_ != false) &&
     (count_1._3_1_ = ON_BinaryArchive::BeginWrite3dmChunk(file,0x20008036,0), count_1._3_1_)) {
    iVar2 = ON_ClassArray<ON_3dmView>::Count(&this->m_named_views);
    count_1._3_1_ = ON_BinaryArchive::WriteInt(file,iVar2);
    count = 0;
    while( true ) {
      local_5a = false;
      if (count < iVar2) {
        local_5a = count_1._3_1_;
      }
      if (local_5a == false) break;
      count_1._3_1_ = ON_BinaryArchive::BeginWrite3dmChunk(file,0x2000803b,0);
      if (count_1._3_1_) {
        pOVar3 = ON_ClassArray<ON_3dmView>::operator[](&this->m_named_views,count);
        count_1._3_1_ = ON_3dmView::Write(pOVar3,file);
        bVar1 = ON_BinaryArchive::EndWrite3dmChunk(file);
        if (!bVar1) {
          count_1._3_1_ = false;
        }
      }
      count = count + 1;
    }
    bVar1 = ON_BinaryArchive::EndWrite3dmChunk(file);
    if (!bVar1) {
      count_1._3_1_ = false;
    }
  }
  if ((count_1._3_1_ != false) &&
     (count_1._3_1_ = ON_BinaryArchive::BeginWrite3dmChunk(file,0x20008037,0), count_1._3_1_)) {
    iVar2 = ON_ClassArray<ON_3dmView>::Count(&this->m_views);
    count_1._3_1_ = ON_BinaryArchive::WriteInt(file,iVar2);
    count = 0;
    while( true ) {
      local_5b = false;
      if (count < iVar2) {
        local_5b = count_1._3_1_;
      }
      if (local_5b == false) break;
      count_1._3_1_ = ON_BinaryArchive::BeginWrite3dmChunk(file,0x2000803b,0);
      if (count_1._3_1_) {
        pOVar3 = ON_ClassArray<ON_3dmView>::operator[](&this->m_views,count);
        count_1._3_1_ = ON_3dmView::Write(pOVar3,file);
        bVar1 = ON_BinaryArchive::EndWrite3dmChunk(file);
        if (!bVar1) {
          count_1._3_1_ = false;
        }
      }
      count = count + 1;
    }
    bVar1 = ON_BinaryArchive::EndWrite3dmChunk(file);
    if (!bVar1) {
      count_1._3_1_ = false;
    }
  }
  if (count_1._3_1_ != false) {
    if (this->m_V5_current_layer_index < 0) {
      local_60 = 0;
    }
    else {
      local_60 = this->m_V5_current_layer_index;
    }
    count_1._3_1_ = ON_BinaryArchive::BeginWrite3dmChunk(file,0xa0000038,local_60);
    bVar1 = ON_BinaryArchive::EndWrite3dmChunk(file);
    if (!bVar1) {
      count_1._3_1_ = false;
    }
  }
  if ((count_1._3_1_ != false) &&
     (count_1._3_1_ = ON_BinaryArchive::BeginWrite3dmChunk(file,0x20008039,0), count_1._3_1_)) {
    if (this->m_V5_current_render_material_index < 0) {
      local_64 = -1;
    }
    else {
      local_64 = this->m_V5_current_render_material_index;
    }
    count_1._3_1_ = ON_BinaryArchive::WriteInt(file,local_64);
    if (count_1._3_1_) {
      count_1._3_1_ = ON_BinaryArchive::WriteInt(file,this->m_current_material_source);
    }
    bVar1 = ON_BinaryArchive::EndWrite3dmChunk(file);
    if (!bVar1) {
      count_1._3_1_ = false;
    }
  }
  if ((count_1._3_1_ != false) &&
     (count_1._3_1_ = ON_BinaryArchive::BeginWrite3dmChunk(file,0x2000803a,0), count_1._3_1_)) {
    count_1._3_1_ = ON_BinaryArchive::WriteColor(file,&this->m_current_color);
    if (count_1._3_1_) {
      count_1._3_1_ = ON_BinaryArchive::WriteInt(file,this->m_current_color_source);
    }
    bVar1 = ON_BinaryArchive::EndWrite3dmChunk(file);
    if (!bVar1) {
      count_1._3_1_ = false;
    }
  }
  if (((count_1._3_1_ != false) &&
      (count_1._3_1_ =
            ON_BinaryArchive::BeginWrite3dmChunk(file,0xa000003c,this->m_current_wire_density),
      count_1._3_1_)) && (bVar1 = ON_BinaryArchive::EndWrite3dmChunk(file), !bVar1)) {
    count_1._3_1_ = false;
  }
  if (count_1._3_1_ != false) {
    count_1._3_1_ = ON_BinaryArchive::BeginWrite3dmChunk(file,0x2000803d,0);
    if (count_1._3_1_) {
      bVar1 = ON_3dmRenderSettings::Write(&this->m_RenderSettings,file);
      count_1._3_1_ = (bool)(-bVar1 & 1);
      bVar1 = ON_BinaryArchive::EndWrite3dmChunk(file);
      if (!bVar1) {
        count_1._3_1_ = false;
      }
    }
    if (((count_1._3_1_ != false) &&
        (iVar2 = ON_BinaryArchive::Archive3dmVersion(file), 0x3b < iVar2)) &&
       ((bVar1 = ON_BinaryArchive::ObjectHasUserDataToWrite
                           (file,&(this->m_RenderSettings).super_ON_Object), bVar1 &&
        (count_1._3_1_ = ON_BinaryArchive::BeginWrite3dmChunk(file,0x20008136,0), count_1._3_1_))))
    {
      count_1._3_1_ =
           ON_BinaryArchive::WriteObjectUserData(file,&(this->m_RenderSettings).super_ON_Object);
      bVar1 = ON_BinaryArchive::BeginWrite3dmChunk(file,0x80027fff,0);
      if (bVar1) {
        bVar1 = ON_BinaryArchive::EndWrite3dmChunk(file);
        if (!bVar1) {
          count_1._3_1_ = false;
        }
      }
      else {
        count_1._3_1_ = false;
      }
      bVar1 = ON_BinaryArchive::EndWrite3dmChunk(file);
      if (!bVar1) {
        count_1._3_1_ = false;
      }
    }
  }
  if ((count_1._3_1_ != false) &&
     (count_1._3_1_ = ON_BinaryArchive::BeginWrite3dmChunk(file,0x2000803f,0), count_1._3_1_)) {
    count_1._3_1_ = ON_3dmConstructionPlaneGridDefaults::Write(&this->m_GridDefaults,file);
    bVar1 = ON_BinaryArchive::EndWrite3dmChunk(file);
    if (!bVar1) {
      count_1._3_1_ = false;
    }
  }
  if (((count_1._3_1_ != false) && (iVar2 = ON_wString::Length(&this->m_model_URL), 0 < iVar2)) &&
     (count_1._3_1_ = ON_BinaryArchive::BeginWrite3dmChunk(file,0x20008131,0), count_1._3_1_)) {
    count_1._3_1_ = ON_BinaryArchive::WriteString(file,&this->m_model_URL);
    bVar1 = ON_BinaryArchive::EndWrite3dmChunk(file);
    if (!bVar1) {
      count_1._3_1_ = false;
    }
  }
  if (count_1._3_1_ != false) {
    if (this->m_V5_current_text_style_index < 0) {
      local_68 = 0;
    }
    else {
      local_68 = this->m_V5_current_text_style_index;
    }
    count_1._3_1_ = ON_BinaryArchive::BeginWrite3dmChunk(file,0xa0000132,local_68);
    bVar1 = ON_BinaryArchive::EndWrite3dmChunk(file);
    if (!bVar1) {
      count_1._3_1_ = false;
    }
  }
  if (count_1._3_1_ != false) {
    if (this->m_V5_current_dimension_style_index < 0) {
      local_6c = 0;
    }
    else {
      local_6c = this->m_V5_current_dimension_style_index;
    }
    count_1._3_1_ = ON_BinaryArchive::BeginWrite3dmChunk(file,0xa0000133,local_6c);
    bVar1 = ON_BinaryArchive::EndWrite3dmChunk(file);
    if (!bVar1) {
      count_1._3_1_ = false;
    }
  }
  if (((count_1._3_1_ != false) && (iVar2 = ON_BinaryArchive::Archive3dmVersion(file), 3 < iVar2))
     && (count_1._3_1_ = ON_BinaryArchive::BeginWrite3dmChunk(file,0x20008134,0), count_1._3_1_)) {
    ON_BinaryArchive::Write3dmChunkVersion(file,1,7);
    count_1._3_1_ = ON_BinaryArchive::WriteDouble(file,this->m_linetype_display_scale);
    if (((count_1._3_1_) &&
        (count_1._3_1_ = ON_BinaryArchive::WriteColor(file,&this->m_current_plot_color),
        count_1._3_1_)) &&
       (count_1._3_1_ = ON_BinaryArchive::WriteInt(file,this->m_current_plot_color_source),
       count_1._3_1_)) {
      if (this->m_V5_current_line_pattern_index < 0) {
        local_70 = -1;
      }
      else {
        local_70 = this->m_V5_current_line_pattern_index;
      }
      count_1._3_1_ = ON_BinaryArchive::WriteInt(file,local_70);
      if ((count_1._3_1_) &&
         (count_1._3_1_ = ON_BinaryArchive::WriteInt(file,this->m_current_linetype_source),
         count_1._3_1_)) {
        count_1._3_1_ = ON_BinaryArchive::BeginWrite3dmChunk(file,0x40008000,1,0);
        if (count_1._3_1_) {
          count_1._3_1_ = ON_3dmUnitsAndTolerances::Write(&this->m_PageUnitsAndTolerances,file);
          bVar1 = ON_BinaryArchive::EndWrite3dmChunk(file);
          if (!bVar1) {
            count_1._3_1_ = false;
          }
        }
        if (((((((count_1._3_1_ != false) &&
                (count_1._3_1_ = ON_BinaryArchive::WriteUuid(file,&this->m_active_view_id),
                count_1._3_1_)) &&
               (count_1._3_1_ = ON_BinaryArchive::WritePoint(file,&this->m_model_basepoint),
               count_1._3_1_)) &&
              ((count_1._3_1_ = ON_EarthAnchorPoint::Write(&this->m_earth_anchor_point,file),
               count_1._3_1_ &&
               (count_1._3_1_ =
                     ON_BinaryArchive::WriteBool
                               (file,(bool)((this->m_IO_settings).m_bSaveTextureBitmapsInFile & 1)),
               count_1._3_1_)))) &&
             ((count_1._3_1_ = ON_3dmIOSettings::Write(&this->m_IO_settings,file), count_1._3_1_ &&
              ((count_1._3_1_ = ON_MeshParameters::Write(&this->m_CustomRenderMeshSettings,file),
               count_1._3_1_ &&
               (count_1._3_1_ = ON_BinaryArchive::WriteUuid(file,&this->m_current_layer_id),
               count_1._3_1_)))))) &&
            (count_1._3_1_ = ON_BinaryArchive::WriteUuid(file,&this->m_current_render_material_id),
            count_1._3_1_)) &&
           (((count_1._3_1_ = ON_BinaryArchive::WriteUuid(file,&this->m_current_line_pattern_id),
             count_1._3_1_ &&
             (count_1._3_1_ = ON_BinaryArchive::WriteUuid(file,&this->m_current_text_style_id),
             count_1._3_1_)) &&
            (count_1._3_1_ = ON_BinaryArchive::WriteUuid(file,&this->m_current_dimension_style_id),
            count_1._3_1_)))) {
          count_1._3_1_ = ON_BinaryArchive::WriteUuid(file,&this->m_current_hatch_pattern_id);
        }
      }
    }
    bVar1 = ON_BinaryArchive::EndWrite3dmChunk(file);
    if (!bVar1) {
      count_1._3_1_ = false;
    }
  }
  if (((count_1._3_1_ != false) &&
      (count_1._3_1_ = ON_BinaryArchive::BeginWrite3dmChunk(file,0xffffffff,0), count_1._3_1_)) &&
     (bVar1 = ON_BinaryArchive::EndWrite3dmChunk(file), !bVar1)) {
    count_1._3_1_ = false;
  }
  return count_1._3_1_;
}

Assistant:

bool ON_3dmSettings::Write_v2(ON_BinaryArchive& file) const
{
  int i;
  bool rc = true;

  // TCODE_SETTINGS_PLUGINLIST - plugins that may have saved userdata in the file
  if (rc && file.Archive3dmVersion() >= 4 && m_plugin_list.Count() > 0 )
  {
    // The plug-in list chunk needs to be first, so the plug-ins that save
    // userdata on views can be loaded as needed.
    rc = file.BeginWrite3dmChunk(TCODE_SETTINGS_PLUGINLIST,0);
    if ( rc ) 
    {
      if (rc) rc = file.Write3dmChunkVersion(1,0);
      if (rc) rc = file.WriteInt( m_plugin_list.Count() );
      for ( i = 0; rc && i < m_plugin_list.Count(); i++ )
      {
        rc = m_plugin_list[i].Write(file);
      }

      if ( !file.EndWrite3dmChunk() )
        rc = false;
    }
  }

  // TCODE_PROPERTIES_UNITSANDTOLS - units and tolerances
  if ( rc  ) {
    rc = file.BeginWrite3dmChunk(TCODE_SETTINGS_UNITSANDTOLS,0);
    if ( rc ) {
      rc = m_ModelUnitsAndTolerances.Write(file);
      if ( !file.EndWrite3dmChunk() )
        rc = false;
    }
  }

  // TCODE_SETTINGS_RENDERMESH - rendering defaults
  if ( rc  ) {
    rc = file.BeginWrite3dmChunk(TCODE_SETTINGS_RENDERMESH,0);
    if ( rc ) {
      rc = m_RenderMeshSettings.Write(file);
      if ( !file.EndWrite3dmChunk() )
        rc = false;
    }
  }

  // TCODE_SETTINGS_ANALYSISMESH - analysis mesh defaults
  if ( rc  ) {
    rc = file.BeginWrite3dmChunk(TCODE_SETTINGS_ANALYSISMESH,0);
    if ( rc ) {
      rc = m_AnalysisMeshSettings.Write(file);
      if ( !file.EndWrite3dmChunk() )
        rc = false;
    }
  }

  // TCODE_SETTINGS_ANNOTATION - annotation settings
  if ( rc  ) {
    rc = file.BeginWrite3dmChunk(TCODE_SETTINGS_ANNOTATION,0);
    if ( rc ) {
      rc = m_AnnotationSettings.Write(file);
      if ( !file.EndWrite3dmChunk() )
        rc = false;
    }
  }

  // TCODE_SETTINGS_NAMED_CPLANE_LIST
  if ( rc  ) {
    rc = file.BeginWrite3dmChunk(TCODE_SETTINGS_NAMED_CPLANE_LIST,0);
    if ( rc ) {
      const int count = m_named_cplanes.Count();
      rc = file.WriteInt(count);
      for ( i = 0; i < count && rc; i++ ) {
        rc = file.BeginWrite3dmChunk( TCODE_VIEW_CPLANE, 0 );
        if (rc ) {
          rc = m_named_cplanes[i].Write(file);
          if ( !file.EndWrite3dmChunk() )
            rc = false;
        }
      }
      if ( !file.EndWrite3dmChunk() )
        rc = false;
    }
  }

  // TCODE_SETTINGS_NAMED_VIEW_LIST
  if ( rc  ) {
    rc = file.BeginWrite3dmChunk(TCODE_SETTINGS_NAMED_VIEW_LIST,0);
    if ( rc ) {
      const int count = m_named_views.Count();
      rc = file.WriteInt(count);
      for ( i = 0; i < count && rc; i++ ) {
        rc = file.BeginWrite3dmChunk( TCODE_VIEW_RECORD, 0 );
        if (rc ) {
          rc = m_named_views[i].Write(file);
          if ( !file.EndWrite3dmChunk() )
            rc = false;
        }
      }
      if ( !file.EndWrite3dmChunk() )
        rc = false;
    }
  }

  // TCODE_SETTINGS_VIEW_LIST
  if ( rc  ) {
    rc = file.BeginWrite3dmChunk(TCODE_SETTINGS_VIEW_LIST,0);
    if ( rc ) {
      const int count = m_views.Count();
      rc = file.WriteInt(count);
      for ( i = 0; i < count && rc; i++ ) {
        rc = file.BeginWrite3dmChunk( TCODE_VIEW_RECORD, 0 );
        if (rc ) {
          rc = m_views[i].Write(file);
          if ( !file.EndWrite3dmChunk() )
            rc = false;
        }
      }
      if ( !file.EndWrite3dmChunk() )
        rc = false;
    }
  }

  // TCODE_SETTINGS_CURRENT_LAYER_INDEX
  if (rc) {
    int V5_index = m_V5_current_layer_index >= 0 ? m_V5_current_layer_index : 0;
    rc = file.BeginWrite3dmChunk( TCODE_SETTINGS_CURRENT_LAYER_INDEX, V5_index );
    if ( !file.EndWrite3dmChunk() )
      rc = false;
  }

  // TCODE_SETTINGS_CURRENT_MATERIAL_INDEX
  if (rc) {
    rc = file.BeginWrite3dmChunk( TCODE_SETTINGS_CURRENT_MATERIAL_INDEX, 0 );
    if (rc) {
      int V5_index = m_V5_current_render_material_index >= 0 ? m_V5_current_render_material_index : -1;
      rc = file.WriteInt( V5_index );
      i = m_current_material_source;
      if (rc) rc = file.WriteInt( i );
      if ( !file.EndWrite3dmChunk() )
        rc = false;
    }
  }

  // TCODE_SETTINGS_CURRENT_COLOR
  if (rc) {
    rc = file.BeginWrite3dmChunk( TCODE_SETTINGS_CURRENT_COLOR, 0 );
    if (rc) {
      rc = file.WriteColor( m_current_color );
      i = m_current_color_source;
      if (rc) rc = file.WriteInt( i );
      if ( !file.EndWrite3dmChunk() )
        rc = false;
    }
  }


  // TCODE_SETTINGS_CURRENT_WIRE_DENSITY
  if (rc) {
    rc = file.BeginWrite3dmChunk( TCODE_SETTINGS_CURRENT_WIRE_DENSITY, m_current_wire_density );
    if (rc) {
      if ( !file.EndWrite3dmChunk() )
        rc = false;
    }
  }

  // TCODE_SETTINGS_RENDER
  if (rc) 
  {
    rc = file.BeginWrite3dmChunk( TCODE_SETTINGS_RENDER, 0 );
    if (rc) 
    {
      rc = m_RenderSettings.Write(file)?true:false;
      if ( !file.EndWrite3dmChunk() )
        rc = false;
    }
    if (rc && file.Archive3dmVersion() >= 60 && file.ObjectHasUserDataToWrite(&m_RenderSettings) )
    {
      // 2016-Nov-28 RH-33298 Dale Lear
      // ON_3dmRenderSettings user data in ON_3dmSettings
      //   I added support for saving userdata attached to the m_RenderSettings ON_3dmRenderSettings.
      //   Ideally, the ON_3dmRenderSettings would be read by calling file.WriteObject(), but
      //   userdata support is being added years after millions of files have been written by calling
      //   ON_3dmRenderSettings.Write()/Read().
      rc = file.BeginWrite3dmChunk( TCODE_SETTINGS_RENDER_USERDATA, 0 );
      if(rc) 
      {
        rc = file.WriteObjectUserData(m_RenderSettings);
        // write a "fake" TCODE_OPENNURBS_CLASS_END end of class mark so I can use
        // ON_BinaryArchive::ReadObjectUserData() to read the m_RenderSettings user data.
        if ( file.BeginWrite3dmChunk( TCODE_OPENNURBS_CLASS_END, 0 ) ) 
        {
          if ( !file.EndWrite3dmChunk() )
            rc = false;
        }
        else
        {
          rc = false;
        }
        if ( !file.EndWrite3dmChunk() ) // end of TCODE_SETTINGS_RENDER_USERDATA
          rc = false;
      }
    }
  }

  // TCODE_SETTINGS_GRID_DEFAULTS
  if (rc) {
    rc = file.BeginWrite3dmChunk( TCODE_SETTINGS_GRID_DEFAULTS, 0 );
    if (rc) {
      rc = m_GridDefaults.Write(file);
      if ( !file.EndWrite3dmChunk() )
        rc = false;
    }
  }

  // TCODE_SETTINGS_MODEL_URL - added 21 June 2001
  if (rc && m_model_URL.Length() > 0 ) {
    rc = file.BeginWrite3dmChunk( TCODE_SETTINGS_MODEL_URL, 0 );
    if (rc) {
      rc = file.WriteString(m_model_URL);
      if ( !file.EndWrite3dmChunk() )
        rc = false;
    }
  }

  // TCODE_SETTINGS_CURRENT_FONT_INDEX - added 10 June 2002
  if (rc) {
    int V5_index = m_V5_current_text_style_index >= 0 ? m_V5_current_text_style_index : 0;
    rc = file.BeginWrite3dmChunk( TCODE_SETTINGS_CURRENT_FONT_INDEX, V5_index );
    if ( !file.EndWrite3dmChunk() )
      rc = false;
  }
    
  // TCODE_SETTINGS_CURRENT_DIMSTYLE_INDEX - added 10 June 2002
  if (rc) {
    int V5_index = m_V5_current_dimension_style_index >= 0 ? m_V5_current_dimension_style_index : 0;
    rc = file.BeginWrite3dmChunk( TCODE_SETTINGS_CURRENT_DIMSTYLE_INDEX, V5_index );
    if ( !file.EndWrite3dmChunk() )
      rc = false;
  }

  // TCODE_SETTINGS_ATTRIBUTES
  if (rc && file.Archive3dmVersion() >= 4 )
  {
    // 23 March 2005 Dale Lear
    rc = file.BeginWrite3dmChunk(TCODE_SETTINGS_ATTRIBUTES, 0 );
    if (rc)
    {
      for(;;)
      {
        // 1.0 - 23 March 2005
        // 1.1 -  6 Feb   2006
        // 1.2 -  1 March 2006
        // 1.3 - 29 March 2006
        // 1.4 - 18 April 2006
        // 1.5 - 21 April 2006
        // 1.6 -  7 June  2006
        // 1.7 - 30 September 2015
        rc = file.Write3dmChunkVersion(1,7);

        // version 1.0 fields 
        rc = file.WriteDouble( m_linetype_display_scale );
        if (!rc) break;

        rc = file.WriteColor(m_current_plot_color);
        if (!rc) break;

        rc = file.WriteInt(m_current_plot_color_source);
        if (!rc) break;

        int V5_index = m_V5_current_line_pattern_index >= 0 ? m_V5_current_line_pattern_index : -1;
        rc = file.WriteInt(V5_index);
        if (!rc) break;

        rc = file.WriteInt(m_current_linetype_source);
        if (!rc) break;

        // 6 Feb 2006, 1.1 fields

        // the units and tols has to be inside a chunk
        rc = file.BeginWrite3dmChunk(TCODE_ANONYMOUS_CHUNK,1,0);
        if (rc)
        {
          rc = m_PageUnitsAndTolerances.Write(file);
          if ( !file.EndWrite3dmChunk() )
            rc = false;
        }
        if (!rc) break;

        // 1 Mar 2006 1.2 fields
        rc = file.WriteUuid(m_active_view_id);
        if (!rc) break;

        // 29 March 2006 1.3 fields
        rc = file.WritePoint( m_model_basepoint);
        if (!rc) break;
        rc = m_earth_anchor_point.Write(file);
        if (!rc) break;

        // 18 April 2006 1.4 fields
        rc = file.WriteBool(m_IO_settings.m_bSaveTextureBitmapsInFile);
        if (!rc) break;

        // 21 April 2006 1.5 fields
        rc = m_IO_settings.Write(file);
        if (!rc) break;

        // 7 June 2006 1.6 fields
        rc = m_CustomRenderMeshSettings.Write(file);
        if (!rc) break;

        // 1.7 - 30 September 2015
        //  switching from indices to ids
        rc = file.WriteUuid(m_current_layer_id);
        if (!rc) break;
        rc = file.WriteUuid(m_current_render_material_id);
        if (!rc) break;
        rc = file.WriteUuid(m_current_line_pattern_id);
        if (!rc) break;
        rc = file.WriteUuid(m_current_text_style_id);
        if (!rc) break;
        rc = file.WriteUuid(m_current_dimension_style_id);
        if (!rc) break;
        rc = file.WriteUuid(m_current_hatch_pattern_id);
        if (!rc) break;

        break;
      }

      if ( !file.EndWrite3dmChunk() )
        rc = false;
    }
  }

  // required TCODE_ENDOFTABLE chunk - marks end of settings table
  if ( rc ) {
    rc = file.BeginWrite3dmChunk( TCODE_ENDOFTABLE, 0 );
    if ( rc ) {
      if ( !file.EndWrite3dmChunk() )
        rc = false;
    }
  }


  return rc;
}